

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

ostream * std::operator<<(ostream *o,StackInst *inst)

{
  long lVar1;
  char *pcVar2;
  undefined1 local_1d0 [8];
  PrintSExpression printer;
  
  ::wasm::PrintSExpression::PrintSExpression((PrintSExpression *)local_1d0,o);
  switch(inst->op) {
  case Basic:
  case BlockBegin:
  case IfBegin:
  case LoopBegin:
  case TryBegin:
    printer.typePrinter.fallbackNames._M_h._M_single_bucket = (__node_base_ptr)local_1d0;
    ::wasm::anon_unknown_0::isFullForced();
    ::wasm::Visitor<wasm::PrintExpressionContents,_void>::visit
              ((Visitor<wasm::PrintExpressionContents,_void> *)
               &printer.typePrinter.fallbackNames._M_h._M_single_bucket,inst->origin);
    goto LAB_00a3d269;
  case BlockEnd:
  case IfEnd:
  case LoopEnd:
  case TryEnd:
    Colors::outputColorCode(o,"\x1b[35m");
    Colors::outputColorCode(o,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(o,"end",3);
    Colors::outputColorCode(o,"\x1b[0m");
    std::__ostream_insert<char,std::char_traits<char>>(o," ;; type: ",10);
    ::wasm::PrintSExpression::printType((PrintSExpression *)local_1d0,(Type)(inst->type).id);
    goto LAB_00a3d269;
  case IfElse:
    Colors::outputColorCode(o,"\x1b[35m");
    Colors::outputColorCode(o,"\x1b[1m");
    lVar1 = 4;
    pcVar2 = "else";
    break;
  case Catch:
    Colors::outputColorCode(o,"\x1b[35m");
    Colors::outputColorCode(o,"\x1b[1m");
    lVar1 = 5;
    pcVar2 = "catch";
    break;
  case CatchAll:
    Colors::outputColorCode(o,"\x1b[35m");
    Colors::outputColorCode(o,"\x1b[1m");
    lVar1 = 9;
    pcVar2 = "catch_all";
    break;
  case Delegate:
    Colors::outputColorCode(o,"\x1b[35m");
    Colors::outputColorCode(o,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(o,"delegate ",9);
    Colors::outputColorCode(o,"\x1b[0m");
    if (inst->origin->_id != TryId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
    }
    ::wasm::Name::print((Name *)&inst->origin[6].type,o);
    goto LAB_00a3d269;
  default:
    ::wasm::handle_unreachable
              ("unexpeted op",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
               ,0xe72);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
  Colors::outputColorCode(o,"\x1b[0m");
LAB_00a3d269:
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&printer.typePrinter.fallback.nameCache._M_h._M_single_bucket);
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&printer.typePrinter.fallback.arrayCount);
  _Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&printer.heapTypes.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (printer._144_8_ != 0) {
    operator_delete((void *)printer._144_8_,
                    (long)printer.heapTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - printer._144_8_);
  }
  if (printer.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
      super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
      super__Optional_payload_base<wasm::ModuleStackIR>._M_payload.field2[0x30] == '\x01') {
    printer.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
    super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
    super__Optional_payload_base<wasm::ModuleStackIR>._M_payload.field2[0x30] = 0;
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>_>
                 *)&printer.moduleStackIR);
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::StackInst& inst) {
  return wasm::printStackInst(&inst, o);
}